

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O0

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::forestPackColumns(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *this)

{
  long lVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  uint *puVar5;
  cpp_dec_float<200U,_int,_void> *in_RDI;
  int *cbeg;
  int *cmax;
  int *clen;
  int *cidx;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *cval;
  Dring *list;
  Dring *ring;
  int colno;
  int j;
  int i;
  int n;
  cpp_dec_float<200U,_int,_void> *this_00;
  undefined8 *local_30;
  uint local_20;
  uint local_1c;
  
  std::
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ::data((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          *)0x6e06a6);
  lVar1 = *(long *)(in_RDI[7].data._M_elems + 0x16);
  lVar2 = *(long *)in_RDI[8].data._M_elems;
  lVar3 = *(long *)(in_RDI[8].data._M_elems + 2);
  this_00 = *(cpp_dec_float<200U,_int,_void> **)&in_RDI[7].fpclass;
  local_1c = 0;
  puVar5 = in_RDI[7].data._M_elems + 0xc;
  for (local_30 = *(undefined8 **)puVar5; (uint *)local_30 != puVar5;
      local_30 = (undefined8 *)*local_30) {
    iVar4 = *(int *)(local_30 + 2);
    if ((this_00->data)._M_elems[iVar4] != local_1c) goto LAB_006e073b;
    local_1c = *(int *)(lVar2 + (long)iVar4 * 4) + local_1c;
    *(undefined4 *)(lVar3 + (long)iVar4 * 4) = *(undefined4 *)(lVar2 + (long)iVar4 * 4);
  }
LAB_006e0871:
  in_RDI[7].data._M_elems[0x15] = local_1c;
  *(undefined4 *)
   (*(long *)(in_RDI[8].data._M_elems + 2) + (long)(int)(in_RDI->data)._M_elems[1] * 4) = 0;
  return;
LAB_006e073b:
  do {
    iVar4 = *(int *)(local_30 + 2);
    local_20 = (this_00->data)._M_elems[iVar4];
    (this_00->data)._M_elems[iVar4] = local_1c;
    *(undefined4 *)(lVar3 + (long)iVar4 * 4) = *(undefined4 *)(lVar2 + (long)iVar4 * 4);
    iVar4 = local_20 + *(int *)(lVar2 + (long)iVar4 * 4);
    for (; (int)local_20 < iVar4; local_20 = local_20 + 1) {
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=(this_00,in_RDI);
      *(undefined4 *)(lVar1 + (long)(int)local_1c * 4) =
           *(undefined4 *)(lVar1 + (long)(int)local_20 * 4);
      local_1c = local_1c + 1;
    }
    local_30 = (undefined8 *)*local_30;
  } while ((uint *)local_30 != puVar5);
  goto LAB_006e0871;
}

Assistant:

void CLUFactor<R>::forestPackColumns()
{
   int n, i, j, colno;
   Dring* ring, *list;

   R* cval = u.col.val.data();
   int* cidx = u.col.idx;
   int* clen = u.col.len;
   int* cmax = u.col.max;
   int* cbeg = u.col.start;

   n = 0;
   list = &u.col.list;

   for(ring = list->next; ring != list; ring = ring->next)
   {
      colno = ring->idx;

      if(cbeg[colno] != n)
      {
         do
         {
            colno = ring->idx;
            i = cbeg[colno];
            cbeg[colno] = n;
            cmax[colno] = clen[colno];
            j = i + clen[colno];

            for(; i < j; ++i)
            {
               cval[n] = cval[i];
               cidx[n++] = cidx[i];
            }

            ring = ring->next;
         }
         while(ring != list);

         goto terminatePackColumns;
      }

      n += clen[colno];

      cmax[colno] = clen[colno];
   }

terminatePackColumns :

   u.col.used = n;
   u.col.max[thedim] = 0;
}